

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zgsrfs.c
# Opt level: O3

void zgsrfs(trans_t trans,SuperMatrix *A,SuperMatrix *L,SuperMatrix *U,int *perm_c,int *perm_r,
           char *equed,double *R,double *C,SuperMatrix *B,SuperMatrix *X,double *ferr,double *berr,
           SuperLUStat_t *stat,int *info)

{
  double *est;
  char cVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  void *pvVar5;
  int *piVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  doublecomplex beta;
  long lVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  long lVar14;
  doublecomplex *pdVar15;
  void *addr;
  long lVar16;
  int iVar17;
  ulong uVar18;
  long lVar19;
  doublecomplex *pdVar20;
  long lVar21;
  long lVar22;
  doublecomplex *pdVar23;
  doublecomplex *pdVar24;
  bool bVar25;
  bool bVar26;
  ulong uVar27;
  int local_280;
  byte local_27a;
  char transc [1];
  double local_278;
  trans_t local_234;
  uint local_230;
  int kase;
  int nrow;
  int ione;
  ulong local_220;
  doublecomplex *local_218;
  int *local_210;
  ulong local_208;
  double local_200;
  long local_1f8;
  doublecomplex *local_1f0;
  long local_1e8;
  long local_1e0;
  SuperMatrix *local_1d8;
  SuperMatrix *local_1d0;
  double local_1c8;
  int *local_1c0;
  int *local_1b8;
  long local_1b0;
  double local_1a8;
  double local_1a0;
  doublecomplex *local_198;
  doublecomplex *local_190;
  SuperMatrix local_188;
  doublecomplex done;
  int isave [3];
  
  ione = 1;
  nrow = A->nrow;
  done.r = 1.0;
  done.i = 0.0;
  pvVar5 = A->Store;
  lVar16 = *(long *)((long)pvVar5 + 8);
  pdVar15 = *(doublecomplex **)((long)B->Store + 8);
  local_190 = *(doublecomplex **)((long)X->Store + 8);
  iVar2 = *B->Store;
  iVar13 = *X->Store;
  lVar14 = (long)iVar13;
  uVar3 = B->ncol;
  uVar27 = (ulong)uVar3;
  *info = 0;
  local_1d8 = U;
  local_1d0 = L;
  if (CONJ < trans) {
    iVar12 = 1;
    iVar17 = -1;
LAB_001048a7:
    *info = iVar17;
    local_280 = iVar12;
    input_error("zgsrfs",&local_280);
    return;
  }
  uVar4 = A->nrow;
  iVar12 = 2;
  iVar17 = -2;
  local_1b0 = lVar14;
  local_198 = pdVar15;
  if (((((int)uVar4 < 0) || (uVar4 != A->ncol)) || (A->Stype != SLU_NC)) ||
     ((A->Dtype != SLU_Z || (A->Mtype != SLU_GE)))) goto LAB_001048a7;
  iVar12 = 3;
  iVar17 = -3;
  local_1e0 = lVar16;
  if ((((L->nrow < 0) || ((L->nrow != L->ncol || (L->Stype != SLU_SC)))) || (L->Dtype != SLU_Z)) ||
     (L->Mtype != SLU_TRLU)) goto LAB_001048a7;
  iVar12 = 4;
  iVar17 = -4;
  if ((((U->nrow < 0) || (U->nrow != U->ncol)) || (U->Stype != SLU_NC)) ||
     ((U->Dtype != SLU_Z || (U->Mtype != SLU_TRU)))) goto LAB_001048a7;
  iVar12 = 10;
  iVar17 = -10;
  local_208 = uVar27;
  local_1c0 = perm_c;
  local_1b8 = perm_r;
  if (((iVar2 < (int)uVar4) || ((B->Stype != SLU_DN || (B->Dtype != SLU_Z)))) ||
     (B->Mtype != SLU_GE)) goto LAB_001048a7;
  iVar12 = 0xb;
  iVar17 = -0xb;
  if ((((iVar13 < (int)uVar4) || (X->Stype != SLU_DN)) || (X->Dtype != SLU_Z)) ||
     (X->Mtype != SLU_GE)) goto LAB_001048a7;
  if (uVar3 == 0 || (ulong)uVar4 == 0) {
    if ((int)uVar3 < 1) {
      return;
    }
    uVar18 = 0;
    do {
      ferr[uVar18] = 0.0;
      berr[uVar18] = 0.0;
      uVar18 = uVar18 + 1;
    } while (uVar27 != uVar18);
    return;
  }
  cVar1 = *equed;
  bVar25 = true;
  if (cVar1 != 'R') {
    bVar25 = cVar1 == 'B';
    bVar26 = true;
    if (cVar1 == 'C') goto LAB_00104a50;
  }
  bVar26 = cVar1 == 'B';
LAB_00104a50:
  pdVar15 = doublecomplexMalloc((ulong)uVar4 * 2);
  addr = superlu_malloc((long)A->nrow << 3);
  local_210 = int32Malloc(A->nrow);
  if ((addr == (void *)0x0 || pdVar15 == (doublecomplex *)0x0) || local_210 == (int *)0x0) {
    sprintf((char *)isave,"%s at line %d in file %s\n","Malloc fails for work/rwork/iwork.",0xe3,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/zgsrfs.c");
    superlu_abort_and_exit((char *)isave);
  }
  if (trans == NOTRANS) {
    transc[0] = 'N';
    local_234 = TRANS;
  }
  else {
    if (trans == TRANS) {
      transc[0] = 'T';
    }
    else {
      transc[0] = 'C';
    }
    local_234 = NOTRANS;
  }
  iVar13 = A->ncol;
  local_1c8 = dmach("Epsilon");
  local_200 = dmach("Safe minimum");
  if (0 < A->nrow) {
    lVar16 = 0;
    do {
      local_210[lVar16] = 0;
      lVar16 = lVar16 + 1;
      local_280 = (int)lVar16;
    } while (local_280 < A->nrow);
  }
  iVar12 = A->ncol;
  if (trans == NOTRANS) {
    if (0 < iVar12) {
      piVar6 = *(int **)((long)pvVar5 + 0x18);
      iVar17 = *piVar6;
      lVar16 = 0;
      do {
        lVar14 = lVar16 + 1;
        lVar16 = lVar16 + 1;
        iVar11 = piVar6[lVar14];
        if (iVar17 < piVar6[lVar14]) {
          lVar14 = *(long *)((long)pvVar5 + 0x10);
          lVar19 = (long)iVar17;
          do {
            local_210[*(int *)(lVar14 + lVar19 * 4)] = local_210[*(int *)(lVar14 + lVar19 * 4)] + 1;
            lVar19 = lVar19 + 1;
            local_280 = (int)lVar19;
          } while (local_280 < piVar6[lVar16]);
          iVar12 = A->ncol;
          iVar11 = piVar6[lVar16];
        }
        iVar17 = iVar11;
      } while (lVar16 < iVar12);
    }
  }
  else if (0 < iVar12) {
    lVar14 = *(long *)((long)pvVar5 + 0x18);
    lVar16 = 0;
    do {
      local_210[lVar16] = *(int *)(lVar14 + 4 + lVar16 * 4) - *(int *)(lVar14 + lVar16 * 4);
      lVar16 = lVar16 + 1;
    } while (lVar16 < A->ncol);
  }
  local_188.Stype = B->Stype;
  local_188.Dtype = B->Dtype;
  local_188.Mtype = B->Mtype;
  local_188.nrow = B->nrow;
  local_188.ncol = 1;
  local_188.Store = superlu_malloc(0x10);
  if ((int *)local_188.Store == (int *)0x0) {
    sprintf((char *)isave,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for Bjcol.Store",0x10c,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/zgsrfs.c");
    superlu_abort_and_exit((char *)isave);
  }
  lVar16 = local_1b0;
  *(int *)local_188.Store = iVar2;
  *(doublecomplex **)((long)local_188.Store + 8) = pdVar15;
  if ((int)local_208 < 1) {
LAB_0010583c:
    superlu_free(pdVar15);
    superlu_free(addr);
    superlu_free(local_210);
    superlu_free(local_188.Store);
    return;
  }
  local_200 = local_200 * (double)(iVar13 + 1);
  local_1a0 = local_200 / local_1c8;
  local_27a = trans == NOTRANS & bVar26;
  bVar25 = (bool)(bVar25 & trans != NOTRANS);
  local_220 = 0;
  local_218 = local_190;
  local_1f0 = local_198;
LAB_00104cef:
  pdVar23 = local_198 + local_220 * (long)iVar2;
  pdVar24 = local_190 + local_220 * local_1b0;
  local_1a8 = 3.0;
  local_230 = 0;
  do {
    zcopy_(&nrow,pdVar23,&ione,pdVar15,&ione);
    beta.i = done.i;
    beta.r = done.r;
    sp_zgemv(transc,(doublecomplex)ZEXT816(0xbff0000000000000),A,pdVar24,ione,beta,pdVar15,ione);
    local_280 = 0;
    if (0 < A->nrow) {
      lVar14 = 0;
      pdVar20 = local_1f0;
      do {
        dVar7 = z_abs1(pdVar20);
        *(double *)((long)addr + lVar14 * 8) = dVar7;
        lVar14 = lVar14 + 1;
        local_280 = (int)lVar14;
        pdVar20 = pdVar20 + 1;
      } while (local_280 < A->nrow);
    }
    iVar13 = A->ncol;
    if (trans == NOTRANS) {
      if (0 < iVar13) {
        lVar14 = 0;
        do {
          dVar7 = z_abs1(pdVar24 + lVar14);
          iVar13 = *(int *)(*(long *)((long)pvVar5 + 0x18) + lVar14 * 4);
          lVar21 = (long)iVar13;
          lVar19 = lVar14 + 1;
          if (iVar13 < *(int *)(*(long *)((long)pvVar5 + 0x18) + 4 + lVar14 * 4)) {
            pdVar20 = (doublecomplex *)(lVar21 * 0x10 + local_1e0);
            do {
              dVar8 = z_abs1(pdVar20);
              lVar14 = (long)*(int *)(*(long *)((long)pvVar5 + 0x10) + lVar21 * 4);
              *(double *)((long)addr + lVar14 * 8) =
                   dVar8 * dVar7 + *(double *)((long)addr + lVar14 * 8);
              lVar21 = lVar21 + 1;
              pdVar20 = pdVar20 + 1;
            } while ((int)lVar21 < *(int *)(*(long *)((long)pvVar5 + 0x18) + lVar19 * 4));
          }
          lVar14 = lVar19;
        } while (lVar19 < A->ncol);
      }
    }
    else if (0 < iVar13) {
      lVar14 = *(long *)((long)pvVar5 + 0x18);
      lVar19 = 0;
      do {
        local_280 = *(int *)(lVar14 + lVar19 * 4);
        lVar22 = (long)local_280;
        dVar7 = 0.0;
        lVar21 = lVar19;
        lVar10 = lVar19 + 1;
        dVar8 = 0.0;
        if (local_280 < *(int *)(lVar14 + 4 + lVar19 * 4)) {
          pdVar20 = (doublecomplex *)(lVar22 * 0x10 + local_1e0);
          local_1f8 = lVar19 + 1;
          local_1e8 = lVar19;
          do {
            iVar13 = *(int *)(*(long *)((long)pvVar5 + 0x10) + lVar22 * 4);
            dVar8 = z_abs1(pdVar20);
            dVar9 = z_abs1(pdVar24 + iVar13);
            dVar7 = dVar7 + dVar9 * dVar8;
            lVar22 = lVar22 + 1;
            local_280 = (int)lVar22;
            lVar14 = *(long *)((long)pvVar5 + 0x18);
            pdVar20 = pdVar20 + 1;
          } while (local_280 < *(int *)(lVar14 + local_1f8 * 4));
          iVar13 = A->ncol;
          lVar21 = local_1e8;
          lVar10 = local_1f8;
          dVar8 = dVar7;
        }
        lVar19 = lVar10;
        *(double *)((long)addr + lVar21 * 8) = dVar8 + *(double *)((long)addr + lVar21 * 8);
      } while (lVar19 < iVar13);
    }
    local_280 = 0;
    if (A->nrow < 1) {
      dVar7 = 0.0;
      bVar26 = false;
    }
    else {
      dVar7 = 0.0;
      lVar14 = 0;
      pdVar20 = pdVar15;
      do {
        dVar8 = *(double *)((long)addr + lVar14 * 8);
        if (dVar8 <= local_1a0) {
          if (((dVar8 != 0.0) || (NAN(dVar8))) &&
             (dVar8 = z_abs1(pdVar20),
             dVar7 <= (dVar8 + local_200) / *(double *)((long)addr + lVar14 * 8))) {
            dVar7 = z_abs1(pdVar20);
            dVar7 = dVar7 + local_200;
            goto LAB_00105024;
          }
        }
        else {
          dVar8 = z_abs1(pdVar20);
          if (dVar7 <= dVar8 / *(double *)((long)addr + lVar14 * 8)) {
            dVar7 = z_abs1(pdVar20);
LAB_00105024:
            dVar7 = dVar7 / *(double *)((long)addr + lVar14 * 8);
          }
        }
        lVar14 = lVar14 + 1;
        local_280 = (int)lVar14;
        pdVar20 = pdVar20 + 1;
      } while (local_280 < A->nrow);
      bVar26 = 0 < A->nrow;
    }
    berr[local_220] = dVar7;
    if (((dVar7 <= local_1c8) || (local_1a8 < dVar7 + dVar7)) || (4 < local_230)) break;
    zgstrs(trans,local_1d0,local_1d8,local_1c0,local_1b8,&local_188,stat,info);
    zaxpy_(&nrow,&done,pdVar15,&ione,pdVar24,&ione);
    local_1a8 = berr[local_220];
    local_230 = local_230 + 1;
  } while( true );
  stat->RefineSteps = local_230;
  local_280 = 0;
  if (bVar26) {
    lVar14 = 0;
    pdVar23 = local_1f0;
    do {
      dVar7 = z_abs1(pdVar23);
      *(double *)((long)addr + lVar14 * 8) = dVar7;
      lVar14 = lVar14 + 1;
      local_280 = (int)lVar14;
      pdVar23 = pdVar23 + 1;
    } while (local_280 < A->nrow);
  }
  iVar13 = A->ncol;
  if (trans == NOTRANS) {
    if (0 < iVar13) {
      lVar14 = 0;
      do {
        dVar7 = z_abs1(pdVar24 + lVar14);
        iVar13 = *(int *)(*(long *)((long)pvVar5 + 0x18) + lVar14 * 4);
        lVar21 = (long)iVar13;
        lVar19 = lVar14 + 1;
        if (iVar13 < *(int *)(*(long *)((long)pvVar5 + 0x18) + 4 + lVar14 * 4)) {
          pdVar23 = (doublecomplex *)(lVar21 * 0x10 + local_1e0);
          do {
            dVar8 = z_abs1(pdVar23);
            lVar14 = (long)*(int *)(*(long *)((long)pvVar5 + 0x10) + lVar21 * 4);
            *(double *)((long)addr + lVar14 * 8) =
                 dVar8 * dVar7 + *(double *)((long)addr + lVar14 * 8);
            lVar21 = lVar21 + 1;
            local_280 = (int)lVar21;
            pdVar23 = pdVar23 + 1;
          } while (local_280 < *(int *)(*(long *)((long)pvVar5 + 0x18) + lVar19 * 4));
        }
        lVar14 = lVar19;
      } while (lVar19 < A->ncol);
    }
  }
  else if (0 < iVar13) {
    lVar14 = *(long *)((long)pvVar5 + 0x18);
    local_1f8 = 0;
    do {
      local_280 = *(int *)(lVar14 + local_1f8 * 4);
      lVar21 = (long)local_280;
      lVar19 = local_1f8 + 1;
      local_278 = 0.0;
      local_1e8 = lVar19;
      if (local_280 < *(int *)(lVar14 + 4 + local_1f8 * 4)) {
        pdVar23 = (doublecomplex *)(lVar21 * 0x10 + local_1e0);
        local_278 = 0.0;
        do {
          dVar7 = z_abs1(pdVar24 + *(int *)(*(long *)((long)pvVar5 + 0x10) + lVar21 * 4));
          dVar8 = z_abs1(pdVar23);
          local_278 = local_278 + dVar8 * dVar7;
          lVar21 = lVar21 + 1;
          local_280 = (int)lVar21;
          lVar14 = *(long *)((long)pvVar5 + 0x18);
          pdVar23 = pdVar23 + 1;
        } while (local_280 < *(int *)(lVar14 + lVar19 * 4));
        iVar13 = A->ncol;
      }
      *(double *)((long)addr + local_1f8 * 8) = local_278 + *(double *)((long)addr + local_1f8 * 8);
      local_1f8 = local_1e8;
    } while (local_1e8 < iVar13);
  }
  if (0 < A->nrow) {
    lVar14 = 0;
    pdVar24 = pdVar15;
    do {
      uVar27 = -(ulong)(local_1a0 < *(double *)((long)addr + lVar14 * 8));
      dVar7 = z_abs(pdVar24);
      dVar7 = (double)(local_210[lVar14] + 1) * local_1c8 * *(double *)((long)addr + lVar14 * 8) +
              dVar7;
      *(ulong *)((long)addr + lVar14 * 8) =
           ~uVar27 & (ulong)(local_200 + dVar7) | (ulong)dVar7 & uVar27;
      lVar14 = lVar14 + 1;
      pdVar24 = pdVar24 + 1;
    } while ((int)lVar14 < A->nrow);
  }
  kase = 0;
  est = ferr + local_220;
  do {
    zlacon2_(&nrow,pdVar15 + A->nrow,pdVar15,est,&kase,isave);
    if (kase == 1) {
      if (local_27a == 0) {
        if ((bVar25) && (iVar13 = A->nrow, 0 < (long)iVar13)) {
          lVar14 = 0;
          do {
            *(double *)((long)&pdVar15->r + lVar14 * 2) =
                 *(double *)((long)&pdVar15->r + lVar14 * 2) * *(double *)((long)R + lVar14);
            *(double *)((long)&pdVar15->i + lVar14 * 2) =
                 *(double *)((long)&pdVar15->i + lVar14 * 2) * *(double *)((long)R + lVar14);
            lVar14 = lVar14 + 8;
          } while ((long)iVar13 * 8 != lVar14);
        }
      }
      else {
        iVar13 = A->ncol;
        if (0 < (long)iVar13) {
          lVar14 = 0;
          do {
            *(double *)((long)&pdVar15->r + lVar14 * 2) =
                 *(double *)((long)&pdVar15->r + lVar14 * 2) * *(double *)((long)C + lVar14);
            *(double *)((long)&pdVar15->i + lVar14 * 2) =
                 *(double *)((long)&pdVar15->i + lVar14 * 2) * *(double *)((long)C + lVar14);
            lVar14 = lVar14 + 8;
          } while ((long)iVar13 * 8 != lVar14);
        }
      }
      zgstrs(local_234,local_1d0,local_1d8,local_1c0,local_1b8,&local_188,stat,info);
      local_280 = A->nrow;
      if ((long)local_280 < 1) {
LAB_00105652:
        local_280 = 0;
      }
      else {
        lVar14 = 0;
        do {
          *(double *)((long)&pdVar15->r + lVar14 * 2) =
               *(double *)((long)&pdVar15->r + lVar14 * 2) * *(double *)((long)addr + lVar14);
          *(double *)((long)&pdVar15->i + lVar14 * 2) =
               *(double *)((long)&pdVar15->i + lVar14 * 2) * *(double *)((long)addr + lVar14);
          lVar14 = lVar14 + 8;
        } while ((long)local_280 << 3 != lVar14);
      }
    }
    else {
      if (kase == 0) break;
      local_280 = A->nrow;
      if ((long)local_280 < 1) {
        local_280 = 0;
      }
      else {
        lVar14 = 0;
        do {
          *(double *)((long)&pdVar15->r + lVar14 * 2) =
               *(double *)((long)&pdVar15->r + lVar14 * 2) * *(double *)((long)addr + lVar14);
          *(double *)((long)&pdVar15->i + lVar14 * 2) =
               *(double *)((long)&pdVar15->i + lVar14 * 2) * *(double *)((long)addr + lVar14);
          lVar14 = lVar14 + 8;
        } while ((long)local_280 << 3 != lVar14);
      }
      zgstrs(trans,local_1d0,local_1d8,local_1c0,local_1b8,&local_188,stat,info);
      if (local_27a == 0) {
        if (bVar25) {
          local_280 = A->ncol;
          if ((long)local_280 < 1) goto LAB_00105652;
          lVar14 = 0;
          do {
            *(double *)((long)&pdVar15->r + lVar14 * 2) =
                 *(double *)((long)&pdVar15->r + lVar14 * 2) * *(double *)((long)R + lVar14);
            *(double *)((long)&pdVar15->i + lVar14 * 2) =
                 *(double *)((long)&pdVar15->i + lVar14 * 2) * *(double *)((long)R + lVar14);
            lVar14 = lVar14 + 8;
          } while ((long)local_280 << 3 != lVar14);
        }
      }
      else {
        local_280 = A->ncol;
        if ((long)local_280 < 1) goto LAB_00105652;
        lVar14 = 0;
        do {
          *(double *)((long)&pdVar15->r + lVar14 * 2) =
               *(double *)((long)&pdVar15->r + lVar14 * 2) * *(double *)((long)C + lVar14);
          *(double *)((long)&pdVar15->i + lVar14 * 2) =
               *(double *)((long)&pdVar15->i + lVar14 * 2) * *(double *)((long)C + lVar14);
          lVar14 = lVar14 + 8;
        } while ((long)local_280 << 3 != lVar14);
      }
    }
  } while (kase != 0);
  local_280 = 0;
  iVar13 = A->nrow;
  if (local_27a == 0) {
    if (bVar25) {
      if (iVar13 < 1) goto LAB_001057f7;
      local_278 = 0.0;
      lVar14 = 0;
      pdVar24 = local_218;
      do {
        dVar7 = R[lVar14];
        dVar8 = z_abs1(pdVar24);
        if (local_278 <= dVar8 * dVar7) {
          dVar7 = R[lVar14];
          local_278 = z_abs1(pdVar24);
          local_278 = local_278 * dVar7;
        }
        lVar14 = lVar14 + 1;
        local_280 = (int)lVar14;
        pdVar24 = pdVar24 + 1;
      } while (local_280 < A->nrow);
    }
    else {
      if (iVar13 < 1) goto LAB_001057f7;
      local_278 = 0.0;
      pdVar24 = local_218;
      iVar13 = 1;
      do {
        iVar12 = iVar13;
        dVar7 = z_abs1(pdVar24);
        if (local_278 <= dVar7) {
          local_278 = z_abs1(pdVar24);
        }
        pdVar24 = pdVar24 + 1;
        iVar13 = iVar12 + 1;
        local_280 = iVar12;
      } while (iVar12 < A->nrow);
    }
  }
  else {
    if (iVar13 < 1) goto LAB_001057f7;
    local_278 = 0.0;
    lVar14 = 0;
    pdVar24 = local_218;
    do {
      dVar7 = C[lVar14];
      dVar8 = z_abs1(pdVar24);
      if (local_278 <= dVar8 * dVar7) {
        dVar7 = C[lVar14];
        local_278 = z_abs1(pdVar24);
        local_278 = local_278 * dVar7;
      }
      lVar14 = lVar14 + 1;
      local_280 = (int)lVar14;
      pdVar24 = pdVar24 + 1;
    } while (local_280 < A->nrow);
  }
  if ((local_278 != 0.0) || (NAN(local_278))) {
    *est = *est / local_278;
  }
LAB_001057f7:
  local_220 = local_220 + 1;
  local_1f0 = local_1f0 + iVar2;
  local_218 = local_218 + lVar16;
  if (local_220 == local_208) goto LAB_0010583c;
  goto LAB_00104cef;
}

Assistant:

void
zgsrfs(trans_t trans, SuperMatrix *A, SuperMatrix *L, SuperMatrix *U,
       int *perm_c, int *perm_r, char *equed, double *R, double *C,
       SuperMatrix *B, SuperMatrix *X, double *ferr, double *berr,
       SuperLUStat_t *stat, int *info)
{


#define ITMAX 5
    
    /* Table of constant values */
    int    ione = 1, nrow = A->nrow;
    doublecomplex ndone = {-1., 0.};
    doublecomplex done = {1., 0.};
    
    /* Local variables */
    NCformat *Astore;
    doublecomplex   *Aval;
    SuperMatrix Bjcol;
    DNformat *Bstore, *Xstore, *Bjcol_store;
    doublecomplex   *Bmat, *Xmat, *Bptr, *Xptr;
    int      kase;
    double   safe1, safe2;
    int      i, j, k, irow, nz, count, notran, rowequ, colequ;
    int      ldb, ldx, nrhs;
    double   s, xk, lstres, eps, safmin;
    char     transc[1];
    trans_t  transt;
    doublecomplex   *work;
    double   *rwork;
    int      *iwork;
    int      isave[3];

    extern int zlacon2_(int *, doublecomplex *, doublecomplex *, double *, int *, int []);

    Astore = A->Store;
    Aval   = Astore->nzval;
    Bstore = B->Store;
    Xstore = X->Store;
    Bmat   = Bstore->nzval;
    Xmat   = Xstore->nzval;
    ldb    = Bstore->lda;
    ldx    = Xstore->lda;
    nrhs   = B->ncol;
    
    /* Test the input parameters */
    *info = 0;
    notran = (trans == NOTRANS);
    if ( !notran && trans != TRANS && trans != CONJ ) *info = -1;
    else if ( A->nrow != A->ncol || A->nrow < 0 ||
	      A->Stype != SLU_NC || A->Dtype != SLU_Z || A->Mtype != SLU_GE )
	*info = -2;
    else if ( L->nrow != L->ncol || L->nrow < 0 ||
 	      L->Stype != SLU_SC || L->Dtype != SLU_Z || L->Mtype != SLU_TRLU )
	*info = -3;
    else if ( U->nrow != U->ncol || U->nrow < 0 ||
 	      U->Stype != SLU_NC || U->Dtype != SLU_Z || U->Mtype != SLU_TRU )
	*info = -4;
    else if ( ldb < SUPERLU_MAX(0, A->nrow) ||
 	      B->Stype != SLU_DN || B->Dtype != SLU_Z || B->Mtype != SLU_GE )
        *info = -10;
    else if ( ldx < SUPERLU_MAX(0, A->nrow) ||
 	      X->Stype != SLU_DN || X->Dtype != SLU_Z || X->Mtype != SLU_GE )
	*info = -11;
    if (*info != 0) {
	i = -(*info);
	input_error("zgsrfs", &i);
	return;
    }

    /* Quick return if possible */
    if ( A->nrow == 0 || nrhs == 0) {
	for (j = 0; j < nrhs; ++j) {
	    ferr[j] = 0.;
	    berr[j] = 0.;
	}
	return;
    }

    rowequ = strncmp(equed, "R", 1)==0 || strncmp(equed, "B", 1)==0;
    colequ = strncmp(equed, "C", 1)==0 || strncmp(equed, "B", 1)==0;
    
    /* Allocate working space */
    work = doublecomplexMalloc(2*A->nrow);
    rwork = (double *) SUPERLU_MALLOC( A->nrow * sizeof(double) );
    iwork = int32Malloc(A->nrow);
    if ( !work || !rwork || !iwork ) 
        ABORT("Malloc fails for work/rwork/iwork.");
    
    if ( notran ) {
	*(unsigned char *)transc = 'N';
        transt = TRANS;
    } else if ( trans == TRANS ) {
	*(unsigned char *)transc = 'T';
	transt = NOTRANS;
    } else if ( trans == CONJ ) {
	*(unsigned char *)transc = 'C';
	transt = NOTRANS;
    }    

    /* NZ = maximum number of nonzero elements in each row of A, plus 1 */
    nz     = A->ncol + 1;
    eps    = dmach("Epsilon");
    safmin = dmach("Safe minimum");

    /* Set SAFE1 essentially to be the underflow threshold times the
       number of additions in each row. */
    safe1  = nz * safmin;
    safe2  = safe1 / eps;

    /* Compute the number of nonzeros in each row (or column) of A */
    for (i = 0; i < A->nrow; ++i) iwork[i] = 0;
    if ( notran ) {
	for (k = 0; k < A->ncol; ++k)
	    for (i = Astore->colptr[k]; i < Astore->colptr[k+1]; ++i) 
		++iwork[Astore->rowind[i]];
    } else {
	for (k = 0; k < A->ncol; ++k)
	    iwork[k] = Astore->colptr[k+1] - Astore->colptr[k];
    }	

    /* Copy one column of RHS B into Bjcol. */
    Bjcol.Stype = B->Stype;
    Bjcol.Dtype = B->Dtype;
    Bjcol.Mtype = B->Mtype;
    Bjcol.nrow  = B->nrow;
    Bjcol.ncol  = 1;
    Bjcol.Store = (void *) SUPERLU_MALLOC( sizeof(DNformat) );
    if ( !Bjcol.Store ) ABORT("SUPERLU_MALLOC fails for Bjcol.Store");
    Bjcol_store = Bjcol.Store;
    Bjcol_store->lda = ldb;
    Bjcol_store->nzval = work; /* address aliasing */
	
    /* Do for each right hand side ... */
    for (j = 0; j < nrhs; ++j) {
	count = 0;
	lstres = 3.;
	Bptr = &Bmat[j*ldb];
	Xptr = &Xmat[j*ldx];

	while (1) { /* Loop until stopping criterion is satisfied. */

	    /* Compute residual R = B - op(A) * X,   
	       where op(A) = A, A**T, or A**H, depending on TRANS. */
	    
#ifdef _CRAY
	    CCOPY(&nrow, Bptr, &ione, work, &ione);
#else
	    zcopy_(&nrow, Bptr, &ione, work, &ione);
#endif
	    sp_zgemv(transc, ndone, A, Xptr, ione, done, work, ione);

	    /* Compute componentwise relative backward error from formula 
	       max(i) ( abs(R(i)) / ( abs(op(A))*abs(X) + abs(B) )(i) )   
	       where abs(Z) is the componentwise absolute value of the matrix
	       or vector Z.  If the i-th component of the denominator is less
	       than SAFE2, then SAFE1 is added to the i-th component of the   
	       numerator before dividing. */

	    for (i = 0; i < A->nrow; ++i) rwork[i] = z_abs1( &Bptr[i] );
	    
	    /* Compute abs(op(A))*abs(X) + abs(B). */
	    if ( notran ) {
		for (k = 0; k < A->ncol; ++k) {
		    xk = z_abs1( &Xptr[k] );
		    for (i = Astore->colptr[k]; i < Astore->colptr[k+1]; ++i)
			rwork[Astore->rowind[i]] += z_abs1(&Aval[i]) * xk;
		}
	    } else {  /* trans = TRANS or CONJ */
		for (k = 0; k < A->ncol; ++k) {
		    s = 0.;
		    for (i = Astore->colptr[k]; i < Astore->colptr[k+1]; ++i) {
			irow = Astore->rowind[i];
			s += z_abs1(&Aval[i]) * z_abs1(&Xptr[irow]);
		    }
		    rwork[k] += s;
		}
	    }
	    s = 0.;
	    for (i = 0; i < A->nrow; ++i) {
		if (rwork[i] > safe2) {
		    s = SUPERLU_MAX( s, z_abs1(&work[i]) / rwork[i] );
                } else if ( rwork[i] != 0.0 ) {
		    s = SUPERLU_MAX( s, (z_abs1(&work[i]) + safe1) / rwork[i] );
                }
                /* If rwork[i] is exactly 0.0, then we know the true 
                   residual also must be exactly 0.0. */
	    }
	    berr[j] = s;

	    /* Test stopping criterion. Continue iterating if   
	       1) The residual BERR(J) is larger than machine epsilon, and   
	       2) BERR(J) decreased by at least a factor of 2 during the   
	          last iteration, and   
	       3) At most ITMAX iterations tried. */

	    if (berr[j] > eps && berr[j] * 2. <= lstres && count < ITMAX) {
		/* Update solution and try again. */
		zgstrs (trans, L, U, perm_c, perm_r, &Bjcol, stat, info);
		
#ifdef _CRAY
		CAXPY(&nrow, &done, work, &ione,
		       &Xmat[j*ldx], &ione);
#else
		zaxpy_(&nrow, &done, work, &ione,
		       &Xmat[j*ldx], &ione);
#endif
		lstres = berr[j];
		++count;
	    } else {
		break;
	    }
        
	} /* end while */

	stat->RefineSteps = count;

	/* Bound error from formula:
	   norm(X - XTRUE) / norm(X) .le. FERR = norm( abs(inv(op(A)))*   
	   ( abs(R) + NZ*EPS*( abs(op(A))*abs(X)+abs(B) ))) / norm(X)   
          where   
            norm(Z) is the magnitude of the largest component of Z   
            inv(op(A)) is the inverse of op(A)   
            abs(Z) is the componentwise absolute value of the matrix or
	       vector Z   
            NZ is the maximum number of nonzeros in any row of A, plus 1   
            EPS is machine epsilon   

          The i-th component of abs(R)+NZ*EPS*(abs(op(A))*abs(X)+abs(B))   
          is incremented by SAFE1 if the i-th component of   
          abs(op(A))*abs(X) + abs(B) is less than SAFE2.   

          Use ZLACON2 to estimate the infinity-norm of the matrix   
             inv(op(A)) * diag(W),   
          where W = abs(R) + NZ*EPS*( abs(op(A))*abs(X)+abs(B) ))) */
	
	for (i = 0; i < A->nrow; ++i) rwork[i] = z_abs1( &Bptr[i] );
	
	/* Compute abs(op(A))*abs(X) + abs(B). */
	if ( notran ) {
	    for (k = 0; k < A->ncol; ++k) {
		xk = z_abs1( &Xptr[k] );
		for (i = Astore->colptr[k]; i < Astore->colptr[k+1]; ++i)
		    rwork[Astore->rowind[i]] += z_abs1(&Aval[i]) * xk;
	    }
	} else {  /* trans == TRANS or CONJ */
	    for (k = 0; k < A->ncol; ++k) {
		s = 0.;
		for (i = Astore->colptr[k]; i < Astore->colptr[k+1]; ++i) {
		    irow = Astore->rowind[i];
		    xk = z_abs1( &Xptr[irow] );
		    s += z_abs1(&Aval[i]) * xk;
		}
		rwork[k] += s;
	    }
	}
	
	for (i = 0; i < A->nrow; ++i)
	    if (rwork[i] > safe2)
		rwork[i] = z_abs(&work[i]) + (iwork[i]+1)*eps*rwork[i];
	    else
		rwork[i] = z_abs(&work[i])+(iwork[i]+1)*eps*rwork[i]+safe1;
	kase = 0;

	do {
	    zlacon2_(&nrow, &work[A->nrow], work, &ferr[j], &kase, isave);
	    if (kase == 0) break;

	    if (kase == 1) {
		/* Multiply by diag(W)*inv(op(A)**T)*(diag(C) or diag(R)). */
		if ( notran && colequ )
		    for (i = 0; i < A->ncol; ++i) {
		        zd_mult(&work[i], &work[i], C[i]);
	            }
		else if ( !notran && rowequ )
		    for (i = 0; i < A->nrow; ++i) {
		        zd_mult(&work[i], &work[i], R[i]);
                    }

		zgstrs (transt, L, U, perm_c, perm_r, &Bjcol, stat, info);
		
		for (i = 0; i < A->nrow; ++i) {
		    zd_mult(&work[i], &work[i], rwork[i]);
	 	}
	    } else {
		/* Multiply by (diag(C) or diag(R))*inv(op(A))*diag(W). */
		for (i = 0; i < A->nrow; ++i) {
		    zd_mult(&work[i], &work[i], rwork[i]);
		}
		
		zgstrs (trans, L, U, perm_c, perm_r, &Bjcol, stat, info);
		
		if ( notran && colequ )
		    for (i = 0; i < A->ncol; ++i) {
		        zd_mult(&work[i], &work[i], C[i]);
		    }
		else if ( !notran && rowequ )
		    for (i = 0; i < A->ncol; ++i) {
		        zd_mult(&work[i], &work[i], R[i]);  
		    }
	    }
	    
	} while ( kase != 0 );

	/* Normalize error. */
	lstres = 0.;
 	if ( notran && colequ ) {
	    for (i = 0; i < A->nrow; ++i)
	    	lstres = SUPERLU_MAX( lstres, C[i] * z_abs1( &Xptr[i]) );
  	} else if ( !notran && rowequ ) {
	    for (i = 0; i < A->nrow; ++i)
	    	lstres = SUPERLU_MAX( lstres, R[i] * z_abs1( &Xptr[i]) );
	} else {
	    for (i = 0; i < A->nrow; ++i)
	    	lstres = SUPERLU_MAX( lstres, z_abs1( &Xptr[i]) );
	}
	if ( lstres != 0. )
	    ferr[j] /= lstres;

    } /* for each RHS j ... */
    
    SUPERLU_FREE(work);
    SUPERLU_FREE(rwork);
    SUPERLU_FREE(iwork);
    SUPERLU_FREE(Bjcol.Store);

    return;

}